

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::EraFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EraOperator>;
  local_10 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EraOperator>;
  local_30 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)local_28,(scalar_function_t *)local_48,
             (scalar_function_t *)&stack0xffffffffffffff98,
             (scalar_function_t *)DatePart::EraOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::EraOperator::PropagateStatistics<duckdb::timestamp_t>,
             ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EraOperator>);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff98);
  ::std::_Function_base::~_Function_base((_Function_base *)local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)local_28);
  return in_RDI;
}

Assistant:

ScalarFunctionSet EraFun::GetFunctions() {
	return GetDatePartFunction<DatePart::EraOperator>();
}